

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_qemu_st_i64_arm
               (TCGContext_conflict *tcg_ctx,TCGv_i64 val,TCGv_i32 addr,TCGArg idx,MemOp memop)

{
  MemOp memop_00;
  TCGv_i64 swap;
  MemOp memop_local;
  TCGArg idx_local;
  TCGv_i32 addr_local;
  TCGv_i64 val_local;
  TCGContext_conflict *tcg_ctx_local;
  
  tcg_gen_req_mo(tcg_ctx,TCG_MO_ST_ST|TCG_MO_LD_ST);
  memop_00 = tcg_canonicalize_memop(memop,true,true);
  gen_ldst_i64(tcg_ctx,INDEX_op_qemu_st_i64,val,addr,memop_00,idx);
  check_exit_request_arm(tcg_ctx);
  return;
}

Assistant:

void tcg_gen_qemu_st_i64(TCGContext *tcg_ctx, TCGv_i64 val, TCGv addr, TCGArg idx, MemOp memop)
{
    TCGv_i64 swap = NULL;

#if TCG_TARGET_REG_BITS == 32
    if ((memop & MO_SIZE) < MO_64) {
        tcg_gen_qemu_st_i32(tcg_ctx, TCGV_LOW(tcg_ctx, val), addr, idx, memop);
        check_exit_request(tcg_ctx);
        return;
    }
#endif

    tcg_gen_req_mo(tcg_ctx, TCG_MO_LD_ST | TCG_MO_ST_ST);
    memop = tcg_canonicalize_memop(memop, 1, 1);

#if !TCG_TARGET_HAS_MEMORY_BSWAP
    if (memop & MO_BSWAP) {
        swap = tcg_temp_new_i64(tcg_ctx);
        switch (memop & MO_SIZE) {
        case MO_16:
            tcg_gen_ext16u_i64(tcg_ctx, swap, val);
            tcg_gen_bswap16_i64(tcg_ctx, swap, swap);
            break;
        case MO_32:
            tcg_gen_ext32u_i64(tcg_ctx, swap, val);
            tcg_gen_bswap32_i64(tcg_ctx, swap, swap);
            break;
        case MO_64:
            tcg_gen_bswap64_i64(tcg_ctx, swap, val);
            break;
        default:
            g_assert_not_reached();
        }
        val = swap;
        memop &= ~MO_BSWAP;
    }
#endif

    gen_ldst_i64(tcg_ctx, INDEX_op_qemu_st_i64, val, addr, memop, idx);

    if (swap) {
        tcg_temp_free_i64(tcg_ctx, swap);
    }
    check_exit_request(tcg_ctx);
}